

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despacer.c
# Opt level: O3

size_t sse4_despace_branchless_u2(char *bytes,size_t howmany)

{
  byte bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  uint uVar7;
  ulong uVar8;
  size_t sVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  if (howmany < 0x20) {
    uVar11 = 0;
    sVar9 = 0;
  }
  else {
    auVar14[8] = 0x20;
    auVar14._0_8_ = 0x2020202020202020;
    auVar14[9] = 0x20;
    auVar14[10] = 0x20;
    auVar14[0xb] = 0x20;
    auVar14[0xc] = 0x20;
    auVar14[0xd] = 0x20;
    auVar14[0xe] = 0x20;
    auVar14[0xf] = 0x20;
    auVar16[8] = 10;
    auVar16._0_8_ = 0xa0a0a0a0a0a0a0a;
    auVar16[9] = 10;
    auVar16[10] = 10;
    auVar16[0xb] = 10;
    auVar16[0xc] = 10;
    auVar16[0xd] = 10;
    auVar16[0xe] = 10;
    auVar16[0xf] = 10;
    auVar18[8] = 0xd;
    auVar18._0_8_ = 0xd0d0d0d0d0d0d0d;
    auVar18[9] = 0xd;
    auVar18[10] = 0xd;
    auVar18[0xb] = 0xd;
    auVar18[0xc] = 0xd;
    auVar18[0xd] = 0xd;
    auVar18[0xe] = 0xd;
    auVar18[0xf] = 0xd;
    sVar9 = 0;
    uVar8 = 0;
    do {
      auVar15 = *(undefined1 (*) [16])(bytes + uVar8);
      auVar17 = *(undefined1 (*) [16])(bytes + uVar8 + 0x10);
      uVar11 = uVar8 + 0x20;
      uVar12 = uVar8 + 0x3f;
      uVar2 = vpcmpeqb_avx512vl(auVar15,auVar14);
      uVar3 = vpcmpeqb_avx512vl(auVar15,auVar16);
      uVar4 = vpcmpeqb_avx512vl(auVar15,auVar18);
      uVar5 = vpcmpeqb_avx512vl(auVar17,auVar16);
      uVar6 = vpcmpeqb_avx512vl(auVar17,auVar14);
      uVar7 = (uint)(ushort)((ushort)uVar3 | (ushort)uVar2 | (ushort)uVar4);
      uVar2 = vpcmpeqb_avx512vl(auVar17,auVar18);
      auVar15 = vpshufb_avx(auVar15,*(undefined1 (*) [16])("" + ((uVar7 & 0x7fff) << 4)));
      lVar13 = (0x10 - POPCOUNT(uVar7)) + sVar9;
      *(undefined1 (*) [16])(bytes + sVar9) = auVar15;
      uVar7 = (uint)(ushort)((ushort)uVar5 | (ushort)uVar6 | (ushort)uVar2);
      auVar15 = vpshufb_avx(auVar17,*(undefined1 (*) [16])("" + ((uVar7 & 0x7fff) << 4)));
      sVar9 = (ulong)(0x10 - POPCOUNT(uVar7)) + lVar13;
      *(undefined1 (*) [16])(bytes + lVar13) = auVar15;
      uVar8 = uVar11;
    } while (uVar12 < howmany);
  }
  if ((uVar11 | 0xf) < howmany) {
    auVar15[8] = 0x20;
    auVar15._0_8_ = 0x2020202020202020;
    auVar15[9] = 0x20;
    auVar15[10] = 0x20;
    auVar15[0xb] = 0x20;
    auVar15[0xc] = 0x20;
    auVar15[0xd] = 0x20;
    auVar15[0xe] = 0x20;
    auVar15[0xf] = 0x20;
    auVar17[8] = 10;
    auVar17._0_8_ = 0xa0a0a0a0a0a0a0a;
    auVar17[9] = 10;
    auVar17[10] = 10;
    auVar17[0xb] = 10;
    auVar17[0xc] = 10;
    auVar17[0xd] = 10;
    auVar17[0xe] = 10;
    auVar17[0xf] = 10;
    auVar19[8] = 0xd;
    auVar19._0_8_ = 0xd0d0d0d0d0d0d0d;
    auVar19[9] = 0xd;
    auVar19[10] = 0xd;
    auVar19[0xb] = 0xd;
    auVar19[0xc] = 0xd;
    auVar19[0xd] = 0xd;
    auVar19[0xe] = 0xd;
    auVar19[0xf] = 0xd;
    uVar8 = uVar11;
    sVar10 = sVar9;
    do {
      auVar14 = *(undefined1 (*) [16])(bytes + uVar8);
      uVar11 = uVar8 + 0x10;
      uVar12 = uVar8 + 0x1f;
      uVar2 = vpcmpeqb_avx512vl(auVar14,auVar15);
      uVar3 = vpcmpeqb_avx512vl(auVar14,auVar17);
      uVar4 = vpcmpeqb_avx512vl(auVar14,auVar19);
      uVar7 = (uint)(ushort)((ushort)uVar3 | (ushort)uVar2 | (ushort)uVar4);
      auVar14 = vpshufb_avx(auVar14,*(undefined1 (*) [16])("" + ((uVar7 & 0x7fff) << 4)));
      sVar9 = (0x10 - POPCOUNT(uVar7)) + sVar10;
      *(undefined1 (*) [16])(bytes + sVar10) = auVar14;
      uVar8 = uVar11;
      sVar10 = sVar9;
    } while (uVar12 < howmany);
  }
  if (uVar11 < howmany) {
    do {
      bVar1 = bytes[uVar11];
      if ((0x20 < (ulong)bVar1) || ((0x100002400U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
        bytes[sVar9] = bVar1;
        sVar9 = sVar9 + 1;
      }
      uVar11 = uVar11 + 1;
    } while (howmany != uVar11);
  }
  return sVar9;
}

Assistant:

size_t sse4_despace_branchless_u2(char *bytes, size_t howmany) {
  size_t pos = 0;
  __m128i spaces = _mm_set1_epi8(' ');
  __m128i newline = _mm_set1_epi8('\n');
  __m128i carriage = _mm_set1_epi8('\r');
  size_t i = 0;
  for (; i + 32 - 1 < howmany; i += 32) {
    __m128i x1 = _mm_loadu_si128((const __m128i *)(bytes + i));
    __m128i x2 = _mm_loadu_si128((const __m128i *)(bytes + i + 16));
    int mask16;
    x1 = cleanm128(x1, spaces, newline, carriage, &mask16);
    _mm_storeu_si128((__m128i *)(bytes + pos), x1);
    pos += 16 - _mm_popcnt_u32(mask16);

    x2 = cleanm128(x2, spaces, newline, carriage, &mask16);
    _mm_storeu_si128((__m128i *)(bytes + pos), x2);
    pos += 16 - _mm_popcnt_u32(mask16);
  }
  for (; i + 16 - 1 < howmany; i += 16) {
    __m128i x = _mm_loadu_si128((const __m128i *)(bytes + i));
    int mask16;
    x = cleanm128(x, spaces, newline, carriage, &mask16);
    _mm_storeu_si128((__m128i *)(bytes + pos), x);
    pos += 16 - _mm_popcnt_u32(mask16);
  }
  for (; i < howmany; i++) {
    char c = bytes[i];
    if (c == '\r' || c == '\n' || c == ' ') {
      continue;
    }
    bytes[pos++] = c;
  }
  return pos;
}